

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

AnnotatedHandler * __thiscall
capnp::JsonCodec::loadAnnotatedHandler
          (JsonCodec *this,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>
  *table;
  Impl *pIVar1;
  Entry *pEVar2;
  word *pwVar3;
  long *plVar4;
  Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_> *pMVar5;
  None *pNVar6;
  Entry *pEVar7;
  size_t newSize;
  AnnotatedHandler *pAVar8;
  bool bVar9;
  Type type;
  Maybe<unsigned_long> MVar10;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  anon_union_8_2_eba6ea51_for_Type_5 local_e0;
  Entry local_d8;
  Fault local_b8;
  DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_b0;
  Maybe<kj::StringPtr> *local_88;
  Vector<capnp::Schema> *local_80;
  Reader local_78;
  ArrayPtr<const_char> local_40;
  
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->annotatedHandlers;
  local_d8.key.baseType = STRUCT;
  local_d8.key.listDepth = '\0';
  local_d8.key.isImplicitParam = false;
  local_d8.key.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  local_d8.key._6_2_ = 0;
  local_d8.value.ptr.disposer = (Disposer *)0x0;
  local_d8.value.ptr.ptr = (AnnotatedHandler *)0x0;
  local_e0 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_d8.key.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)schema.super_Schema.raw;
  local_88 = unionDeclName;
  local_80 = dependencies;
  MVar10 = kj::
           Table<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Callbacks>_>
           ::Impl<0UL,_false>::insert
                     ((Impl<0UL,_false> *)&local_78,&table->table,
                      (long)(pIVar1->annotatedHandlers).table.rows.builder.pos -
                      (long)(pIVar1->annotatedHandlers).table.rows.builder.ptr >> 5,&local_d8,
                      0xffffffff);
  pAVar8 = local_d8.value.ptr.ptr;
  if (local_78._reader.segment._0_1_ == (Impl<0UL,_false>)0x1) {
    pEVar7 = (table->table).rows.builder.ptr;
    local_b0.left = &pEVar7[(long)local_78._reader.capTable].value;
    local_d8.value.ptr.ptr = (AnnotatedHandler *)0x0;
    bVar9 = pEVar7[(long)local_78._reader.capTable].value.ptr.ptr == (AnnotatedHandler *)0x0;
    local_b0.right = (None *)&kj::none;
    local_b0.op.content.ptr = " != ";
    local_b0.op.content.size_ = 5;
    local_b0.result = !bVar9;
    if (bVar9) {
      Schema::getProto(&local_78,(Schema *)&local_e0);
      local_40 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_78);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[32],capnp::Text::Reader>
                (&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x5ad,FAILED,"existing != kj::none",
                 "_kjCondition,\"cyclic JSON flattening detected\", schema.getProto().getDisplayName()"
                 ,&local_b0,(char (*) [32])"cyclic JSON flattening detected",(Reader *)&local_40);
      kj::_::Debug::Fault::fatal(&local_b8);
    }
    if (pAVar8 == (AnnotatedHandler *)0x0) {
      pEVar7 = pEVar7 + (long)local_78._reader.capTable;
    }
    else {
      (**(local_d8.value.ptr.disposer)->_vptr_Disposer)
                (local_d8.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(pAVar8->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                         super_HandlerBase._vptr_HandlerBase +
                 (long)(pAVar8->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                       super_HandlerBase._vptr_HandlerBase[-2]),MVar10.ptr.field_1.value);
      pAVar8 = local_d8.value.ptr.ptr;
      pEVar7 = (table->table).rows.builder.ptr + (long)local_78._reader.capTable;
      if (local_d8.value.ptr.ptr != (AnnotatedHandler *)0x0) {
        local_d8.value.ptr.ptr = (AnnotatedHandler *)0x0;
        (**(local_d8.value.ptr.disposer)->_vptr_Disposer)
                  (local_d8.value.ptr.disposer,
                   (_func_int *)
                   ((long)&(pAVar8->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                           super_HandlerBase._vptr_HandlerBase +
                   (long)(pAVar8->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                         super_HandlerBase._vptr_HandlerBase[-2]));
      }
    }
  }
  else {
    pEVar7 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    if (pEVar7 == (pIVar1->annotatedHandlers).table.rows.builder.endPtr) {
      pEVar2 = (table->table).rows.builder.ptr;
      newSize = 4;
      if (pEVar7 != pEVar2) {
        newSize = (long)pEVar7 - (long)pEVar2 >> 4;
      }
      kj::
      Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry>
      ::setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,_std::nullptr_t>_>_>::Entry>
                     *)table,newSize);
      pEVar7 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    }
    (pEVar7->key).baseType = local_d8.key.baseType;
    (pEVar7->key).listDepth = local_d8.key.listDepth;
    (pEVar7->key).isImplicitParam = local_d8.key.isImplicitParam;
    (pEVar7->key).field_3 = local_d8.key.field_3;
    *(undefined2 *)&(pEVar7->key).field_0x6 = local_d8.key._6_2_;
    (pEVar7->key).field_4 = local_d8.key.field_4;
    (pEVar7->value).ptr.disposer = local_d8.value.ptr.disposer;
    (pEVar7->value).ptr.ptr = local_d8.value.ptr.ptr;
    pEVar7 = (pIVar1->annotatedHandlers).table.rows.builder.pos;
    (pIVar1->annotatedHandlers).table.rows.builder.pos = pEVar7 + 1;
  }
  pAVar8 = (pEVar7->value).ptr.ptr;
  if (pAVar8 == (AnnotatedHandler *)0x0) {
    kj::
    heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
              ((kj *)&local_b0,this,(StructSchema *)&local_e0,discriminator,local_88,local_80);
    pAVar8 = (AnnotatedHandler *)local_b0.right;
    pMVar5 = local_b0.left;
    local_b0.right = (None *)0x0;
    kj::
    Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Callbacks>>
    ::find<0ul,capnp::StructSchema&>
              ((Table<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler,decltype(nullptr)>>>::Callbacks>>
                *)&local_78,(StructSchema *)&((this->impl).ptr)->annotatedHandlers);
    if (local_78._reader.segment == (SegmentReader *)0x0) {
      local_d8.key.baseType = VOID;
      local_d8.key.listDepth = '\0';
      local_d8.key.isImplicitParam = false;
      local_d8.key.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      local_d8.key._6_2_ = 0;
      local_78._reader.segment = (SegmentReader *)0x0;
      local_78._reader.capTable = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_d8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_d8);
    }
    pwVar3 = ((local_78._reader.segment)->ptr).ptr;
    plVar4 = (long *)((local_78._reader.segment)->ptr).size_;
    ((local_78._reader.segment)->ptr).ptr = (word *)pMVar5;
    ((local_78._reader.segment)->ptr).size_ = (size_t)pAVar8;
    if (plVar4 != (long *)0x0) {
      (**(code **)pwVar3->content)(pwVar3,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    type.field_4.schema = local_e0.schema;
    type.baseType = STRUCT;
    type.listDepth = '\0';
    type.isImplicitParam = false;
    type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    type._6_2_ = 0;
    addTypeHandlerImpl(this,type,(HandlerBase *)pAVar8);
    pNVar6 = local_b0.right;
    if (local_b0.right != (None *)0x0) {
      local_b0.right = (None *)0x0;
      (*(code *)(((local_b0.left)->ptr).disposer)->_vptr_Disposer)
                (local_b0.left,pNVar6 + *(long *)(*(long *)pNVar6 + -0x10));
    }
  }
  return pAVar8;
}

Assistant:

JsonCodec::AnnotatedHandler& JsonCodec::loadAnnotatedHandler(
      StructSchema schema, kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
      kj::Maybe<kj::StringPtr> unionDeclName, kj::Vector<Schema>& dependencies) {
  auto& entry = impl->annotatedHandlers.upsert(schema, kj::none,
      [&](kj::Maybe<kj::Own<AnnotatedHandler>>& existing, auto dummy) {
    KJ_ASSERT(existing != kj::none,
        "cyclic JSON flattening detected", schema.getProto().getDisplayName());
  });

  KJ_IF_SOME(v, entry.value) {
    // Already exists.
    return *v;
  } else {
    // Not seen before.
    auto newHandler = kj::heap<AnnotatedHandler>(
          *this, schema, discriminator, unionDeclName, dependencies);
    auto& result = *newHandler;

    // Map may have changed, so we have to look up again.
    KJ_ASSERT_NONNULL(impl->annotatedHandlers.find(schema)) = kj::mv(newHandler);

    addTypeHandler(schema, result);
    return result;
  }